

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expand_environment_variables.cpp
# Opt level: O1

string * tlx::expand_environment_variables(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + s->_M_string_length);
  expand_environment_variables(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string expand_environment_variables(const std::string& s) {
    std::string copy = s;
    expand_environment_variables(&copy);
    return copy;
}